

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O1

void __thiscall HPresolve::resizeImpliedBounds(HPresolve *this)

{
  double dVar1;
  pointer piVar2;
  pointer pdVar3;
  pointer pdVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  vector<double,_std::allocator<double>_> teup;
  vector<double,_std::allocator<double>_> temp;
  vector<double,_std::allocator<double>_> local_78;
  vector<double,_std::allocator<double>_> local_60;
  pointer local_48;
  pointer local_40;
  HPresolve *local_38;
  
  std::vector<double,_std::allocator<double>_>::vector(&local_60,&this->implRowDualLower);
  std::vector<double,_std::allocator<double>_>::vector(&local_78,&this->implRowDualUpper);
  std::vector<double,_std::allocator<double>_>::resize
            (&this->implRowDualLower,(long)(this->super_HPreData).numRow);
  std::vector<double,_std::allocator<double>_>::resize
            (&this->implRowDualUpper,(long)(this->super_HPreData).numRow);
  uVar5 = (ulong)(this->super_HPreData).numRowOriginal;
  if (0 < (long)uVar5) {
    piVar2 = (this->super_HPreData).flagRow.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar9 = (long)(this->super_HPreData).flagRow.super__Vector_base<int,_std::allocator<int>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)piVar2 >> 2;
    uVar6 = (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    pdVar3 = (this->implRowDualLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar10 = (long)(this->implRowDualLower).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)pdVar3 >> 3;
    uVar12 = (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
    pdVar4 = (this->implRowDualUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = (long)(this->implRowDualUpper).super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)pdVar4 >> 3;
    uVar17 = 0;
    iVar13 = 0;
    do {
      uVar15 = uVar9;
      uVar16 = uVar9;
      if (uVar9 == uVar17) {
LAB_0013eea6:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar16,uVar15);
      }
      if (piVar2[uVar17] != 0) {
        uVar15 = uVar6;
        uVar16 = uVar17;
        if ((((uVar6 <= uVar17) ||
             (uVar14 = (ulong)iVar13, uVar15 = uVar10, uVar16 = uVar14, uVar10 <= uVar14)) ||
            (pdVar3[uVar14] =
                  local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar17], uVar15 = uVar12, uVar16 = uVar17,
            uVar12 <= uVar17)) || (uVar15 = uVar8, uVar16 = uVar14, uVar8 <= uVar14))
        goto LAB_0013eea6;
        pdVar4[uVar14] =
             local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar17];
        iVar13 = iVar13 + 1;
      }
      uVar17 = uVar17 + 1;
    } while (uVar5 != uVar17);
  }
  std::vector<double,_std::allocator<double>_>::operator=(&local_60,&this->implRowValueLower);
  std::vector<double,_std::allocator<double>_>::operator=(&local_78,&this->implRowValueUpper);
  std::vector<double,_std::allocator<double>_>::resize
            (&this->implRowValueLower,(long)(this->super_HPreData).numRow);
  std::vector<double,_std::allocator<double>_>::resize
            (&this->implRowValueUpper,(long)(this->super_HPreData).numRow);
  uVar5 = (ulong)(this->super_HPreData).numRowOriginal;
  local_38 = this;
  if (0 < (long)uVar5) {
    piVar2 = (this->super_HPreData).flagRow.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar12 = (long)(this->super_HPreData).flagRow.super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)piVar2 >> 2;
    uVar8 = (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    local_40 = (this->super_HPreData).rowLower.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start;
    uVar10 = (long)(this->super_HPreData).rowLower.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)local_40 >> 3;
    local_48 = (this->implRowValueLower).super__Vector_base<double,_std::allocator<double>_>._M_impl
               .super__Vector_impl_data._M_start;
    uVar17 = (long)(this->implRowValueLower).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)local_48 >> 3;
    uVar16 = (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
    pdVar3 = (this->super_HPreData).rowUpper.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar15 = (long)(this->super_HPreData).rowUpper.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pdVar3 >> 3;
    pdVar4 = (this->implRowValueUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = (long)(this->implRowValueUpper).super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)pdVar4 >> 3;
    uVar9 = 0;
    iVar13 = 0;
    do {
      uVar14 = uVar12;
      uVar11 = uVar12;
      if (uVar12 == uVar9) goto LAB_0013eee4;
      if (piVar2[uVar9] != 0) {
        uVar14 = uVar8;
        uVar11 = uVar9;
        if ((uVar8 <= uVar9) || (uVar14 = uVar10, uVar10 <= uVar9)) {
LAB_0013eee4:
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar11,uVar14);
        }
        dVar1 = local_40[uVar9];
        if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar9] <= dVar1 &&
            dVar1 != local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar9]) {
          local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar9] = dVar1;
        }
        uVar7 = (ulong)iVar13;
        uVar14 = uVar17;
        uVar11 = uVar7;
        if (((uVar17 <= uVar7) ||
            (local_48[uVar7] =
                  local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar9], uVar14 = uVar16, uVar11 = uVar9,
            uVar16 <= uVar9)) || (uVar14 = uVar15, uVar15 <= uVar9)) goto LAB_0013eee4;
        dVar1 = pdVar3[uVar9];
        if (dVar1 < local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar9]) {
          local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar9] = dVar1;
        }
        uVar14 = uVar6;
        uVar11 = uVar7;
        if (uVar6 <= uVar7) goto LAB_0013eee4;
        pdVar4[uVar7] =
             local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar9];
        iVar13 = iVar13 + 1;
      }
      uVar9 = uVar9 + 1;
    } while (uVar5 != uVar9);
  }
  std::vector<double,_std::allocator<double>_>::operator=(&local_60,&this->implColDualLower);
  std::vector<double,_std::allocator<double>_>::operator=(&local_78,&this->implColDualUpper);
  std::vector<double,_std::allocator<double>_>::resize
            (&this->implColDualLower,(long)(this->super_HPreData).numCol);
  std::vector<double,_std::allocator<double>_>::resize
            (&this->implColDualUpper,(long)(this->super_HPreData).numCol);
  uVar5 = (ulong)(this->super_HPreData).numColOriginal;
  if (0 < (long)uVar5) {
    piVar2 = (this->super_HPreData).flagCol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar9 = (long)(this->super_HPreData).flagCol.super__Vector_base<int,_std::allocator<int>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)piVar2 >> 2;
    uVar6 = (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    pdVar3 = (this->implColDualLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar10 = (long)(this->implColDualLower).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)pdVar3 >> 3;
    uVar12 = (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
    pdVar4 = (this->implColDualUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = (long)(this->implColDualUpper).super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)pdVar4 >> 3;
    uVar17 = 0;
    iVar13 = 0;
    do {
      uVar15 = uVar9;
      uVar16 = uVar9;
      if (uVar9 == uVar17) {
LAB_0013ef10:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar16,uVar15);
      }
      if (piVar2[uVar17] != 0) {
        uVar15 = uVar6;
        uVar16 = uVar17;
        if ((((uVar6 <= uVar17) ||
             (uVar14 = (ulong)iVar13, uVar15 = uVar10, uVar16 = uVar14, uVar10 <= uVar14)) ||
            (pdVar3[uVar14] =
                  local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar17], uVar15 = uVar12, uVar16 = uVar17,
            uVar12 <= uVar17)) || (uVar15 = uVar8, uVar16 = uVar14, uVar8 <= uVar14))
        goto LAB_0013ef10;
        pdVar4[uVar14] =
             local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar17];
        iVar13 = iVar13 + 1;
      }
      uVar17 = uVar17 + 1;
    } while (uVar5 != uVar17);
  }
  std::vector<double,_std::allocator<double>_>::operator=(&local_60,&this->implColLower);
  std::vector<double,_std::allocator<double>_>::operator=(&local_78,&this->implColUpper);
  std::vector<double,_std::allocator<double>_>::resize
            (&this->implColLower,(long)(this->super_HPreData).numCol);
  std::vector<double,_std::allocator<double>_>::resize
            (&this->implColUpper,(long)(this->super_HPreData).numCol);
  uVar5 = (ulong)(this->super_HPreData).numColOriginal;
  if (0 < (long)uVar5) {
    piVar2 = (this->super_HPreData).flagCol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar12 = (long)(this->super_HPreData).flagCol.super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)piVar2 >> 2;
    uVar6 = (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    local_40 = (this->super_HPreData).colLower.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start;
    uVar10 = (long)(this->super_HPreData).colLower.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)local_40 >> 3;
    local_48 = (this->implColLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    uVar17 = (long)(this->implColLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)local_48 >> 3;
    uVar16 = (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
    pdVar3 = (this->super_HPreData).colUpper.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar15 = (long)(this->super_HPreData).colUpper.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pdVar3 >> 3;
    pdVar4 = (this->implColUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = (long)(this->implColUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pdVar4 >> 3;
    uVar9 = 0;
    iVar13 = 0;
    do {
      uVar14 = uVar12;
      uVar11 = uVar12;
      if (uVar12 == uVar9) goto LAB_0013ef4e;
      if (piVar2[uVar9] != 0) {
        uVar14 = uVar6;
        uVar11 = uVar9;
        if ((uVar6 <= uVar9) || (uVar14 = uVar10, uVar10 <= uVar9)) {
LAB_0013ef4e:
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar11,uVar14);
        }
        dVar1 = local_40[uVar9];
        if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar9] <= dVar1 &&
            dVar1 != local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar9]) {
          local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar9] = dVar1;
        }
        uVar7 = (ulong)iVar13;
        uVar14 = uVar17;
        uVar11 = uVar7;
        if (((uVar17 <= uVar7) ||
            (local_48[uVar7] =
                  local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar9], uVar14 = uVar16, uVar11 = uVar9,
            uVar16 <= uVar9)) || (uVar14 = uVar15, uVar15 <= uVar9)) goto LAB_0013ef4e;
        dVar1 = pdVar3[uVar9];
        if (dVar1 < local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar9]) {
          local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar9] = dVar1;
        }
        uVar14 = uVar8;
        uVar11 = uVar7;
        if (uVar8 <= uVar7) goto LAB_0013ef4e;
        pdVar4[uVar7] =
             local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar9];
        iVar13 = iVar13 + 1;
      }
      uVar9 = uVar9 + 1;
    } while (uVar5 != uVar9);
  }
  if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void HPresolve::resizeImpliedBounds() {
    //implied bounds for crashes
	//row duals
    vector<double> temp = implRowDualLower;
    vector<double> teup = implRowDualUpper;
    implRowDualLower.resize(numRow);
    implRowDualUpper.resize(numRow);

    int k=0;
    for (int i=0;i<numRowOriginal;++i)
    	if (flagRow.at(i)) {
    		implRowDualLower.at(k) = temp.at(i);
    		implRowDualUpper.at(k) = teup.at(i);
    		k++;
	    }

    //row value
    temp = implRowValueLower;
    teup = implRowValueUpper;
    implRowValueLower.resize(numRow);
    implRowValueUpper.resize(numRow);
    k=0;
    for (int i=0;i<numRowOriginal;++i)
    	if (flagRow.at(i)) {
    		if (temp.at(i) < rowLower.at(i))
    			temp.at(i) = rowLower.at(i);
    		implRowValueLower.at(k) = temp.at(i);
    		if (teup.at(i) > rowUpper.at(i))
    			teup.at(i) = rowUpper.at(i);
    		implRowValueUpper.at(k) = teup.at(i);
    		k++;
	    }

    //column dual
    temp = implColDualLower;
    teup = implColDualUpper;
    implColDualLower.resize(numCol);
    implColDualUpper.resize(numCol);

    k=0;
    for (int i=0;i<numColOriginal;++i)
    	if (flagCol.at(i)) {
    		implColDualLower.at(k) = temp.at(i);
    		implColDualUpper.at(k) = teup.at(i);
    		k++;
	    }

    //column value
    temp = implColLower;
    teup = implColUpper;
    implColLower.resize(numCol);
    implColUpper.resize(numCol);

    k=0;
    for (int i=0;i<numColOriginal;++i)
    	if (flagCol.at(i)) {
    		if (temp.at(i) < colLower.at(i))
    			temp.at(i) = colLower.at(i);
    		implColLower.at(k) = temp.at(i);
    		if (teup.at(i) > colUpper.at(i))
    			teup.at(i) = colUpper.at(i);
    		implColUpper.at(k) = teup.at(i);
    		k++;
	    }
}